

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyDowngradeTypography(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  uint uVar2;
  tmbstr local_38;
  tmbstr p;
  uint c;
  uint i;
  Lexer *lexer;
  Node *next;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  _c = doc->lexer;
  next = node;
  node_local = &doc->root;
  while (next != (Node *)0x0) {
    lexer = (Lexer *)next->next;
    BVar1 = prvTidynodeIsText(next);
    if (BVar1 != no) {
      local_38 = _c->lexbuf + next->start;
      for (p._4_4_ = next->start; p._4_4_ < next->end; p._4_4_ = p._4_4_ + 1) {
        p._0_4_ = (uint)(byte)_c->lexbuf[p._4_4_];
        if (0x7f < (uint)p) {
          uVar2 = prvTidyGetUTF8(_c->lexbuf + p._4_4_,(uint *)&p);
          p._4_4_ = uVar2 + p._4_4_;
        }
        if ((0x2012 < (uint)p) && ((uint)p < 0x201f)) {
          if ((uint)p - 0x2013 < 2) {
            p._0_4_ = 0x2d;
          }
          else if ((uint)p - 0x2018 < 3) {
            p._0_4_ = 0x27;
          }
          else if ((uint)p - 0x201c < 3) {
            p._0_4_ = 0x22;
          }
        }
        local_38 = prvTidyPutUTF8(local_38,(uint)p);
      }
      next->end = (int)local_38 - (int)_c->lexbuf;
    }
    if (next->content != (Node *)0x0) {
      prvTidyDowngradeTypography((TidyDocImpl *)node_local,next->content);
    }
    next = (Node *)lexer;
  }
  return;
}

Assistant:

void TY_(DowngradeTypography)(TidyDocImpl* doc, Node* node)
{
    Node* next;
    Lexer* lexer = doc->lexer;

    while (node)
    {
        next = node->next;

        if (TY_(nodeIsText)(node))
        {
            uint i, c;
            tmbstr p = lexer->lexbuf + node->start;

            for (i = node->start; i < node->end; ++i)
            {
                c = (unsigned char) lexer->lexbuf[i];

                if (c > 0x7F)
                    i += TY_(GetUTF8)(lexer->lexbuf + i, &c);

                if (c >= 0x2013 && c <= 0x201E)
                {
                    switch (c)
                    {
                    case 0x2013: /* en dash */
                    case 0x2014: /* em dash */
                        c = '-';
                        break;
                    case 0x2018: /* left single  quotation mark */
                    case 0x2019: /* right single quotation mark */
                    case 0x201A: /* single low-9 quotation mark */
                        c = '\'';
                        break;
                    case 0x201C: /* left double  quotation mark */
                    case 0x201D: /* right double quotation mark */
                    case 0x201E: /* double low-9 quotation mark */
                        c = '"';
                        break;
                    }
                }

                p = TY_(PutUTF8)(p, c);
            }

            node->end = p - lexer->lexbuf;
        }

        if (node->content)
            TY_(DowngradeTypography)(doc, node->content);

        node = next;
    }
}